

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_hadamard_4x4_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  longlong *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i src [4];
  undefined1 auVar3 [16];
  undefined1 auVar7 [16];
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar5 [16];
  undefined1 auVar9 [16];
  
  src[0][0] = *(longlong *)src_diff;
  src[0][1] = 0;
  src[1][0] = *(longlong *)(src_diff + src_stride);
  src[1][1] = 0;
  plVar1 = (longlong *)((long)(src_diff + src_stride) + src_stride * 2);
  src[2][0] = *plVar1;
  src[2][1] = 0;
  src[3][0] = *(longlong *)((long)plVar1 + src_stride * 2);
  src[3][1] = 0;
  hadamard_col4_sse2(src,0);
  hadamard_col4_sse2(src,1);
  auVar13._8_8_ = src[0][1];
  auVar13._0_8_ = src[0][0];
  auVar10._8_8_ = src[1][0];
  auVar10._0_8_ = src[0][0];
  auVar12 = psraw(auVar10,0xf);
  auVar5._0_12_ = auVar13._0_12_;
  auVar5._12_2_ = (short)((ulong)src[0][0] >> 0x30);
  auVar5._14_2_ = auVar12._6_2_;
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._0_10_ = auVar13._0_10_;
  auVar4._10_2_ = auVar12._4_2_;
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._8_2_ = (short)((ulong)src[0][0] >> 0x20);
  auVar3._0_8_ = src[0][0];
  auVar2._8_8_ = auVar3._8_8_;
  auVar2._6_2_ = auVar12._2_2_;
  auVar2._4_2_ = (short)((ulong)src[0][0] >> 0x10);
  auVar2._0_2_ = (undefined2)src[0][0];
  auVar2._2_2_ = auVar12._0_2_;
  *(undefined1 (*) [16])coeff = auVar2;
  *(short *)(coeff + 4) = (short)src[1][0];
  *(short *)((long)coeff + 0x12) = auVar12._8_2_;
  *(short *)(coeff + 5) = (short)((ulong)src[1][0] >> 0x10);
  *(short *)((long)coeff + 0x16) = auVar12._10_2_;
  *(short *)(coeff + 6) = (short)((ulong)src[1][0] >> 0x20);
  *(short *)((long)coeff + 0x1a) = auVar12._12_2_;
  *(short *)(coeff + 7) = (short)((ulong)src[1][0] >> 0x30);
  *(short *)((long)coeff + 0x1e) = auVar12._14_2_;
  auVar12._8_8_ = src[2][1];
  auVar12._0_8_ = src[2][0];
  auVar11._8_8_ = src[3][0];
  auVar11._0_8_ = src[2][0];
  auVar13 = psraw(auVar11,0xf);
  auVar9._0_12_ = auVar12._0_12_;
  auVar9._12_2_ = (short)((ulong)src[2][0] >> 0x30);
  auVar9._14_2_ = auVar13._6_2_;
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = auVar12._0_10_;
  auVar8._10_2_ = auVar13._4_2_;
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._8_2_ = (short)((ulong)src[2][0] >> 0x20);
  auVar7._0_8_ = src[2][0];
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = auVar13._2_2_;
  auVar6._4_2_ = (short)((ulong)src[2][0] >> 0x10);
  auVar6._0_2_ = (undefined2)src[2][0];
  auVar6._2_2_ = auVar13._0_2_;
  *(undefined1 (*) [16])(coeff + 8) = auVar6;
  *(short *)(coeff + 0xc) = (short)src[3][0];
  *(short *)((long)coeff + 0x32) = auVar13._8_2_;
  *(short *)(coeff + 0xd) = (short)((ulong)src[3][0] >> 0x10);
  *(short *)((long)coeff + 0x36) = auVar13._10_2_;
  *(short *)(coeff + 0xe) = (short)((ulong)src[3][0] >> 0x20);
  *(short *)((long)coeff + 0x3a) = auVar13._12_2_;
  *(short *)(coeff + 0xf) = (short)((ulong)src[3][0] >> 0x30);
  *(short *)((long)coeff + 0x3e) = auVar13._14_2_;
  return;
}

Assistant:

void aom_hadamard_4x4_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                           tran_low_t *coeff) {
  __m128i src[4];
  src[0] = _mm_loadl_epi64((const __m128i *)src_diff);
  src[1] = _mm_loadl_epi64((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_loadl_epi64((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_loadl_epi64((const __m128i *)(src_diff + src_stride));

  hadamard_col4_sse2(src, 0);
  hadamard_col4_sse2(src, 1);

  store_tran_low(_mm_unpacklo_epi64(src[0], src[1]), coeff);
  coeff += 8;
  store_tran_low(_mm_unpacklo_epi64(src[2], src[3]), coeff);
}